

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

vw * parse_args(options_i *options,trace_message_t trace_listener,void *trace_context)

{
  byte bVar1;
  int iVar2;
  vw *this;
  typed_option<unsigned_long> *ptVar3;
  parser *this_00;
  option_group_definition *poVar4;
  AllReduceSockets *this_01;
  vw_exception *this_02;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  allocator local_14b7;
  allocator local_14b6;
  allocator local_14b5;
  allocator local_14b4;
  allocator local_14b3;
  allocator local_14b2;
  allocator local_14b1;
  allocator local_14b0;
  allocator local_14af;
  allocator local_14ae;
  allocator local_14ad;
  allocator local_14ac;
  allocator local_14ab;
  allocator local_14aa;
  allocator local_14a9;
  string local_14a8 [32];
  string local_1488 [32];
  string local_1468 [32];
  size_t ring_size;
  allocator local_1440 [32];
  allocator local_1420 [32];
  size_t node_arg;
  size_t total_arg;
  size_t unique_id_arg;
  option_group_definition weight_args;
  undefined1 local_1368 [160];
  string local_12c8;
  string local_12a8;
  string local_1288;
  string local_1268;
  string local_1248;
  string local_1228;
  string local_1208;
  string local_11e8;
  string local_11c8;
  string local_11a8;
  string local_1188;
  string local_1168;
  string local_1148;
  string local_1128;
  string local_1108;
  string local_10e8;
  undefined1 local_10c8 [160];
  string local_1028;
  string local_1008;
  string local_fe8;
  string local_fc8;
  string local_fa8;
  string local_f88;
  undefined1 local_f68 [160];
  undefined1 local_ec8 [160];
  stringstream __msg;
  undefined1 local_e18 [64];
  string local_dd8 [312];
  string local_ca0;
  option_group_definition parallelization_args;
  option_group_definition update_args;
  option_group_definition vw_args;
  string span_server_arg;
  string local_b40 [112];
  typed_option<unsigned_long> local_ad0;
  typed_option<unsigned_long> local_a30;
  typed_option<unsigned_long> local_990;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_850;
  typed_option<bool> local_7b0;
  typed_option<bool> local_710;
  typed_option<bool> local_670;
  typed_option<bool> local_5d0;
  typed_option<float> local_530;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_490;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  typed_option<double> local_350;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<unsigned_long> local_d0;
  
  this = (vw *)operator_new(0x3658);
  vw::vw(this);
  this->options = options;
  if (trace_listener != (trace_message_t)0x0) {
    *(trace_message_t *)&(this->trace_message).super_ostream.field_0x80 = trace_listener;
    *(void **)&(this->trace_message).super_ostream.field_0x78 = trace_context;
  }
  time(&this->init_time);
  std::__cxx11::string::string((string *)&local_f88,"VW options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&vw_args,&local_f88);
  std::__cxx11::string::~string((string *)&local_f88);
  std::__cxx11::string::string((string *)&local_fa8,"ring_size",(allocator *)local_f68);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_fa8,&ring_size);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)&__msg,0x100);
  std::__cxx11::string::string((string *)local_1368,"size of example ring",(allocator *)local_10c8);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,ptVar3);
  VW::config::option_group_definition::add<unsigned_long>(&vw_args,&local_d0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_d0);
  std::__cxx11::string::~string((string *)local_1368);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_fa8);
  (**options->_vptr_options_i)(options,&vw_args);
  this_00 = (parser *)operator_new(0x390);
  parser::parser(this_00,ring_size);
  this->p = this_00;
  std::__cxx11::string::string((string *)&local_fc8,"Update options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&update_args,&local_fc8);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::__cxx11::string::string((string *)&local_fe8,"learning_rate",(allocator *)&unique_id_arg);
  VW::config::typed_option<float>::typed_option((typed_option<float> *)&__msg,&local_fe8,&this->eta)
  ;
  std::__cxx11::string::string
            ((string *)&span_server_arg,"Set learning rate",(allocator *)&total_arg);
  std::__cxx11::string::_M_assign((string *)(local_e18 + 0x20));
  std::__cxx11::string::string((string *)local_ec8,"l",(allocator *)&node_arg);
  std::__cxx11::string::_M_assign(local_dd8);
  VW::config::typed_option<float>::typed_option(&local_170,(typed_option<float> *)&__msg);
  poVar4 = VW::config::option_group_definition::add<float>(&update_args,&local_170);
  std::__cxx11::string::string((string *)&local_1008,"power_t",local_1420);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1368,&local_1008,&this->power_t);
  std::__cxx11::string::string((string *)&weight_args,"t power value",local_1440);
  std::__cxx11::string::_M_assign((string *)(local_1368 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_210,(typed_option<float> *)local_1368);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_210);
  std::__cxx11::string::string((string *)&local_1028,"decay_learning_rate",&local_14b6);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_f68,&local_1028,&this->eta_decay_rate);
  std::__cxx11::string::string
            (local_14a8,"Set Decay factor for learning_rate between passes",&local_14b7);
  std::__cxx11::string::_M_assign((string *)(local_f68 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_2b0,(typed_option<float> *)local_f68);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_2b0);
  std::__cxx11::string::string((string *)&local_10e8,"initial_t",&local_14b2);
  VW::config::typed_option<double>::typed_option
            ((typed_option<double> *)local_10c8,&local_10e8,&this->sd->t);
  std::__cxx11::string::string(local_1468,"initial t value",&local_14b3);
  std::__cxx11::string::_M_assign((string *)(local_10c8 + 0x30));
  VW::config::typed_option<double>::typed_option(&local_350,(typed_option<double> *)local_10c8);
  poVar4 = VW::config::option_group_definition::add<double>(poVar4,&local_350);
  std::__cxx11::string::string((string *)&local_1108,"feature_mask",&local_14b4);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&parallelization_args,&local_1108,&this->feature_mask);
  std::__cxx11::string::string
            (local_1488,
             "Use existing regressor to determine which parameters may be updated.  If no initial_regressor given, also used for initial weights."
             ,&local_14b5);
  std::__cxx11::string::_M_assign
            ((string *)
             &parallelization_args.m_options.
              super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_3f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&parallelization_args);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar4,&local_3f0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_3f0);
  std::__cxx11::string::~string(local_1488);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&parallelization_args);
  std::__cxx11::string::~string((string *)&local_1108);
  VW::config::typed_option<double>::~typed_option(&local_350);
  std::__cxx11::string::~string(local_1468);
  VW::config::typed_option<double>::~typed_option((typed_option<double> *)local_10c8);
  std::__cxx11::string::~string((string *)&local_10e8);
  VW::config::typed_option<float>::~typed_option(&local_2b0);
  std::__cxx11::string::~string(local_14a8);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_f68);
  std::__cxx11::string::~string((string *)&local_1028);
  VW::config::typed_option<float>::~typed_option(&local_210);
  std::__cxx11::string::~string((string *)&weight_args);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_1368);
  std::__cxx11::string::~string((string *)&local_1008);
  VW::config::typed_option<float>::~typed_option(&local_170);
  std::__cxx11::string::~string((string *)local_ec8);
  std::__cxx11::string::~string((string *)&span_server_arg);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_fe8);
  (**options->_vptr_options_i)(options,&update_args);
  std::__cxx11::string::string((string *)&local_1128,"Weight options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&weight_args,&local_1128);
  std::__cxx11::string::~string((string *)&local_1128);
  std::__cxx11::string::string((string *)&local_1148,"initial_regressor",&local_14b6);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__msg,&local_1148,&this->initial_regressors);
  std::__cxx11::string::string(local_14a8,"Initial regressor(s)",&local_14b7);
  std::__cxx11::string::_M_assign((string *)(local_e18 + 0x20));
  std::__cxx11::string::string(local_1468,"i",&local_14b2);
  std::__cxx11::string::_M_assign(local_dd8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_490,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__msg);
  poVar4 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (&weight_args,&local_490);
  std::__cxx11::string::string((string *)&local_1168,"initial_weight",&local_14b3);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1368,&local_1168,&this->initial_weight);
  std::__cxx11::string::string(local_1488,"Set all weights to an initial value of arg.",&local_14b4)
  ;
  std::__cxx11::string::_M_assign((string *)(local_1368 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_530,(typed_option<float> *)local_1368);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_530);
  std::__cxx11::string::string((string *)&local_1188,"random_weights",&local_14b5);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_f68,&local_1188,&this->random_weights);
  std::__cxx11::string::string((string *)&unique_id_arg,"make initial weights random",&local_14a9);
  std::__cxx11::string::_M_assign((string *)(local_f68 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_5d0,(typed_option<bool> *)local_f68);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_5d0);
  std::__cxx11::string::string((string *)&local_11a8,"normal_weights",&local_14aa);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_10c8,&local_11a8,&this->normal_weights);
  std::__cxx11::string::string((string *)&total_arg,"make initial weights normal",&local_14ab);
  std::__cxx11::string::_M_assign((string *)(local_10c8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_670,(typed_option<bool> *)local_10c8);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_670);
  std::__cxx11::string::string((string *)&local_11c8,"truncated_normal_weights",&local_14ac);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&parallelization_args,&local_11c8,&this->tnormal_weights);
  std::__cxx11::string::string
            ((string *)&node_arg,"make initial weights truncated normal",&local_14ad);
  std::__cxx11::string::_M_assign
            ((string *)
             &parallelization_args.m_options.
              super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  VW::config::typed_option<bool>::typed_option
            (&local_710,(typed_option<bool> *)&parallelization_args);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_710);
  std::__cxx11::string::string((string *)&local_11e8,"sparse_weights",&local_14ae);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&span_server_arg,&local_11e8,&(this->weights).sparse);
  std::__cxx11::string::string
            ((string *)local_1420,"Use a sparse datastructure for weights",&local_14af);
  std::__cxx11::string::_M_assign(local_b40);
  VW::config::typed_option<bool>::typed_option(&local_7b0,(typed_option<bool> *)&span_server_arg);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_7b0);
  std::__cxx11::string::string((string *)&local_1208,"input_feature_regularizer",&local_14b0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_ec8,&local_1208,&this->per_feature_regularizer_input);
  std::__cxx11::string::string
            ((string *)local_1440,"Per feature regularization input file",&local_14b1);
  std::__cxx11::string::_M_assign((string *)(local_ec8 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_850,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_ec8);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar4,&local_850);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_850);
  std::__cxx11::string::~string((string *)local_1440);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_ec8);
  std::__cxx11::string::~string((string *)&local_1208);
  VW::config::typed_option<bool>::~typed_option(&local_7b0);
  std::__cxx11::string::~string((string *)local_1420);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&span_server_arg);
  std::__cxx11::string::~string((string *)&local_11e8);
  VW::config::typed_option<bool>::~typed_option(&local_710);
  std::__cxx11::string::~string((string *)&node_arg);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&parallelization_args);
  std::__cxx11::string::~string((string *)&local_11c8);
  VW::config::typed_option<bool>::~typed_option(&local_670);
  std::__cxx11::string::~string((string *)&total_arg);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_10c8);
  std::__cxx11::string::~string((string *)&local_11a8);
  VW::config::typed_option<bool>::~typed_option(&local_5d0);
  std::__cxx11::string::~string((string *)&unique_id_arg);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_f68);
  std::__cxx11::string::~string((string *)&local_1188);
  VW::config::typed_option<float>::~typed_option(&local_530);
  std::__cxx11::string::~string(local_1488);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_1368);
  std::__cxx11::string::~string((string *)&local_1168);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_490);
  std::__cxx11::string::~string(local_1468);
  std::__cxx11::string::~string(local_14a8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__msg);
  std::__cxx11::string::~string((string *)&local_1148);
  (**options->_vptr_options_i)(options,&weight_args);
  span_server_arg._M_dataplus._M_p = (pointer)&span_server_arg.field_2;
  span_server_arg._M_string_length = 0;
  span_server_arg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_1228,"Parallelization options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&parallelization_args,&local_1228);
  std::__cxx11::string::~string((string *)&local_1228);
  std::__cxx11::string::string((string *)&local_1248,"span_server",local_1420);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_1248,&span_server_arg);
  std::__cxx11::string::string
            ((string *)local_ec8,"Location of server for setting up spanning tree",local_1440);
  std::__cxx11::string::_M_assign((string *)(local_e18 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_8f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  poVar4 = VW::config::option_group_definition::add<std::__cxx11::string>
                     (&parallelization_args,&local_8f0);
  std::__cxx11::string::string((string *)&local_1268,"unique_id",&local_14b6);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1368,&local_1268,&unique_id_arg);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_1368,0);
  std::__cxx11::string::string(local_14a8,"unique id used for cluster parallel jobs",&local_14b7);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_990,ptVar3);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_990);
  std::__cxx11::string::string((string *)&local_1288,"total",&local_14b2);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_f68,&local_1288,&total_arg);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_f68,1);
  std::__cxx11::string::string
            (local_1468,"total number of nodes used in cluster parallel job",&local_14b3);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_a30,ptVar3);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_a30);
  std::__cxx11::string::string((string *)&local_12a8,"node",&local_14b4);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_10c8,&local_12a8,&node_arg);
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_10c8,0);
  std::__cxx11::string::string(local_1488,"node number in cluster parallel job",&local_14b5);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_ad0,ptVar3);
  VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_ad0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_ad0);
  std::__cxx11::string::~string(local_1488);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_10c8);
  std::__cxx11::string::~string((string *)&local_12a8);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_a30);
  std::__cxx11::string::~string(local_1468);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_f68);
  std::__cxx11::string::~string((string *)&local_1288);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_990);
  std::__cxx11::string::~string(local_14a8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_1368);
  std::__cxx11::string::~string((string *)&local_1268);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_8f0);
  std::__cxx11::string::~string((string *)local_ec8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_1248);
  (**options->_vptr_options_i)(options,&parallelization_args);
  std::__cxx11::string::string((string *)&__msg,"total",(allocator *)local_1468);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  bVar1 = (byte)iVar2;
  if (bVar1 == 0) {
    std::__cxx11::string::string((string *)local_1368,"node",(allocator *)local_1488);
    iVar2 = (*options->_vptr_options_i[1])(options,local_1368);
    if ((char)iVar2 != '\0') goto LAB_001441d2;
    std::__cxx11::string::string((string *)local_f68,"unique_id",local_1420);
    iVar2 = (*options->_vptr_options_i[1])(options,local_f68);
    bVar6 = 1;
    bVar5 = bVar6;
    if ((char)iVar2 != '\0') goto LAB_001441d5;
    bVar7 = 0;
LAB_001442d9:
    std::__cxx11::string::~string((string *)local_f68);
    if (bVar6 == 0) goto LAB_001442f8;
  }
  else {
LAB_001441d2:
    bVar5 = 0;
LAB_001441d5:
    bVar6 = bVar1 ^ 1;
    std::__cxx11::string::string((string *)local_10c8,"total",local_1440);
    iVar2 = (*options->_vptr_options_i[1])(options,local_10c8);
    bVar7 = 1;
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::string((string *)local_ec8,"node",&local_14b6);
      iVar2 = (*options->_vptr_options_i[1])(options,local_ec8);
      bVar7 = 1;
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string(local_14a8,"unique_id",&local_14b7);
        iVar2 = (*options->_vptr_options_i[1])(options,local_14a8);
        bVar7 = (byte)iVar2 ^ 1;
        std::__cxx11::string::~string(local_14a8);
      }
      std::__cxx11::string::~string((string *)local_ec8);
    }
    std::__cxx11::string::~string((string *)local_10c8);
    if (bVar5 != 0) goto LAB_001442d9;
    if (bVar1 != 0) goto LAB_001442f8;
  }
  std::__cxx11::string::~string((string *)local_1368);
LAB_001442f8:
  std::__cxx11::string::~string((string *)&__msg);
  if (bVar7 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<((ostream *)local_e18,
                    "you must specificy unique_id, total, and node if you specify any");
    this_02 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_02,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
               ,0x544,&local_ca0);
    __cxa_throw(this_02,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::__cxx11::string::string((string *)&__msg,"span_server",(allocator *)local_10c8);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar2 != '\0') {
    this->all_reduce_type = Socket;
    this_01 = (AllReduceSockets *)operator_new(0x70);
    std::__cxx11::string::string((string *)&local_12c8,(string *)&span_server_arg);
    AllReduceSockets::AllReduceSockets(this_01,&local_12c8,unique_id_arg,total_arg,node_arg);
    this->all_reduce = (AllReduce *)this_01;
    std::__cxx11::string::~string((string *)&local_12c8);
  }
  parse_diagnostics(options,this);
  this->initial_t = (float)this->sd->t;
  VW::config::option_group_definition::~option_group_definition(&parallelization_args);
  std::__cxx11::string::~string((string *)&span_server_arg);
  VW::config::option_group_definition::~option_group_definition(&weight_args);
  VW::config::option_group_definition::~option_group_definition(&update_args);
  VW::config::option_group_definition::~option_group_definition(&vw_args);
  return this;
}

Assistant:

vw& parse_args(options_i& options, trace_message_t trace_listener, void* trace_context)
{
  vw& all = *(new vw());
  all.options = &options;

  if (trace_listener)
  {
    all.trace_message.trace_listener = trace_listener;
    all.trace_message.trace_context = trace_context;
  }

  try
  {
    time(&all.init_time);

    size_t ring_size;
    option_group_definition vw_args("VW options");
    vw_args.add(make_option("ring_size", ring_size).default_value(256).help("size of example ring"));
    options.add_and_parse(vw_args);

    all.p = new parser{ring_size};

    option_group_definition update_args("Update options");
    update_args.add(make_option("learning_rate", all.eta).help("Set learning rate").short_name("l"))
        .add(make_option("power_t", all.power_t).help("t power value"))
        .add(make_option("decay_learning_rate", all.eta_decay_rate)
                 .help("Set Decay factor for learning_rate between passes"))
        .add(make_option("initial_t", all.sd->t).help("initial t value"))
        .add(make_option("feature_mask", all.feature_mask)
                 .help("Use existing regressor to determine which parameters may be updated.  If no initial_regressor "
                       "given, also used for initial weights."));
    options.add_and_parse(update_args);

    option_group_definition weight_args("Weight options");
    weight_args
        .add(make_option("initial_regressor", all.initial_regressors).help("Initial regressor(s)").short_name("i"))
        .add(make_option("initial_weight", all.initial_weight).help("Set all weights to an initial value of arg."))
        .add(make_option("random_weights", all.random_weights).help("make initial weights random"))
        .add(make_option("normal_weights", all.normal_weights).help("make initial weights normal"))
        .add(make_option("truncated_normal_weights", all.tnormal_weights).help("make initial weights truncated normal"))
        .add(make_option("sparse_weights", all.weights.sparse).help("Use a sparse datastructure for weights"))
        .add(make_option("input_feature_regularizer", all.per_feature_regularizer_input)
                 .help("Per feature regularization input file"));
    options.add_and_parse(weight_args);

    std::string span_server_arg;
    // bool threads_arg;
    size_t unique_id_arg;
    size_t total_arg;
    size_t node_arg;
    option_group_definition parallelization_args("Parallelization options");
    parallelization_args
        .add(make_option("span_server", span_server_arg).help("Location of server for setting up spanning tree"))
        //(make_option("threads", threads_arg).help("Enable multi-threading")) Unused option?
        .add(make_option("unique_id", unique_id_arg).default_value(0).help("unique id used for cluster parallel jobs"))
        .add(
            make_option("total", total_arg).default_value(1).help("total number of nodes used in cluster parallel job"))
        .add(make_option("node", node_arg).default_value(0).help("node number in cluster parallel job"));
    options.add_and_parse(parallelization_args);

    // total, unique_id and node must be specified together.
    if ((options.was_supplied("total") || options.was_supplied("node") || options.was_supplied("unique_id")) &&
        !(options.was_supplied("total") && options.was_supplied("node") && options.was_supplied("unique_id")))
    {
      THROW("you must specificy unique_id, total, and node if you specify any");
    }

    if (options.was_supplied("span_server"))
    {
      all.all_reduce_type = AllReduceType::Socket;
      all.all_reduce = new AllReduceSockets(span_server_arg, unique_id_arg, total_arg, node_arg);
    }

    parse_diagnostics(options, all);

    all.initial_t = (float)all.sd->t;
    return all;
  }
  catch (...)
  {
    VW::finish(all);
    throw;
  }
}